

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_info.c
# Opt level: O0

void info_print_revision(lyout *out,lys_revision *rev,uint8_t rev_size)

{
  int local_20;
  int i;
  uint8_t rev_size_local;
  lys_revision *rev_local;
  lyout *out_local;
  
  ly_print(out,"%-*s",0xb,"Revisions: ");
  if (rev_size == '\0') {
    ly_print(out,"\n");
  }
  else {
    ly_print(out,"%s\n",rev);
    for (local_20 = 1; local_20 < (int)(uint)rev_size; local_20 = local_20 + 1) {
      ly_print(out,"%*s%s\n",0xb,"",rev + local_20);
    }
  }
  return;
}

Assistant:

static void
info_print_revision(struct lyout *out, const struct lys_revision *rev, uint8_t rev_size)
{
    int i;

    ly_print(out, "%-*s", INDENT_LEN, "Revisions: ");

    if (rev_size) {
        ly_print(out, "%s\n", rev[0].date);
        for (i = 1; i < rev_size; ++i) {
            ly_print(out, "%*s%s\n", INDENT_LEN, "", rev[i].date);
        }
    } else {
        ly_print(out, "\n");
    }
}